

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

int Shift(uint8_t *word,int word_len,uint16_t parameter)

{
  int iVar1;
  uint uVar2;
  uint32_t scalar;
  uint16_t parameter_local;
  int word_len_local;
  uint8_t *word_local;
  int local_4;
  
  iVar1 = (parameter & 0x7fff) + (0x1000000 - (parameter & 0x8000));
  if (*word < 0x80) {
    *word = *word + (char)iVar1 & 0x7f;
    local_4 = 1;
  }
  else if (*word < 0xc0) {
    local_4 = 1;
  }
  else if (*word < 0xe0) {
    if (word_len < 2) {
      local_4 = 1;
    }
    else {
      uVar2 = (word[1] & 0x3f | (*word & 0x1f) << 6) + iVar1;
      *word = (byte)(uVar2 >> 6) & 0x1f | 0xc0;
      word[1] = word[1] & 0xc0 | (byte)uVar2 & 0x3f;
      local_4 = 2;
    }
  }
  else {
    local_4 = word_len;
    if (*word < 0xf0) {
      if (2 < word_len) {
        uVar2 = (word[2] & 0x3f | (word[1] & 0x3f) << 6 | (*word & 0xf) << 0xc) + iVar1;
        *word = (byte)(uVar2 >> 0xc) & 0xf | 0xe0;
        word[1] = word[1] & 0xc0 | (byte)(uVar2 >> 6) & 0x3f;
        word[2] = word[2] & 0xc0 | (byte)uVar2 & 0x3f;
        local_4 = 3;
      }
    }
    else if (*word < 0xf8) {
      if (3 < word_len) {
        uVar2 = (word[3] & 0x3f | (word[2] & 0x3f) << 6 | (word[1] & 0x3f) << 0xc |
                (*word & 7) << 0x12) + iVar1;
        *word = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
        word[1] = word[1] & 0xc0 | (byte)(uVar2 >> 0xc) & 0x3f;
        word[2] = word[2] & 0xc0 | (byte)(uVar2 >> 6) & 0x3f;
        word[3] = word[3] & 0xc0 | (byte)uVar2 & 0x3f;
        local_4 = 4;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int Shift(uint8_t* word, int word_len, uint16_t parameter) {
  /* Limited sign extension: scalar < (1 << 24). */
  uint32_t scalar =
      (parameter & 0x7FFFu) + (0x1000000u - (parameter & 0x8000u));
  if (word[0] < 0x80) {
    /* 1-byte rune / 0sssssss / 7 bit scalar (ASCII). */
    scalar += (uint32_t)word[0];
    word[0] = (uint8_t)(scalar & 0x7Fu);
    return 1;
  } else if (word[0] < 0xC0) {
    /* Continuation / 10AAAAAA. */
    return 1;
  } else if (word[0] < 0xE0) {
    /* 2-byte rune / 110sssss AAssssss / 11 bit scalar. */
    if (word_len < 2) return 1;
    scalar += (uint32_t)((word[1] & 0x3Fu) | ((word[0] & 0x1Fu) << 6u));
    word[0] = (uint8_t)(0xC0 | ((scalar >> 6u) & 0x1F));
    word[1] = (uint8_t)((word[1] & 0xC0) | (scalar & 0x3F));
    return 2;
  } else if (word[0] < 0xF0) {
    /* 3-byte rune / 1110ssss AAssssss BBssssss / 16 bit scalar. */
    if (word_len < 3) return word_len;
    scalar += (uint32_t)((word[2] & 0x3Fu) | ((word[1] & 0x3Fu) << 6u) |
        ((word[0] & 0x0Fu) << 12u));
    word[0] = (uint8_t)(0xE0 | ((scalar >> 12u) & 0x0F));
    word[1] = (uint8_t)((word[1] & 0xC0) | ((scalar >> 6u) & 0x3F));
    word[2] = (uint8_t)((word[2] & 0xC0) | (scalar & 0x3F));
    return 3;
  } else if (word[0] < 0xF8) {
    /* 4-byte rune / 11110sss AAssssss BBssssss CCssssss / 21 bit scalar. */
    if (word_len < 4) return word_len;
    scalar += (uint32_t)((word[3] & 0x3Fu) | ((word[2] & 0x3Fu) << 6u) |
        ((word[1] & 0x3Fu) << 12u) | ((word[0] & 0x07u) << 18u));
    word[0] = (uint8_t)(0xF0 | ((scalar >> 18u) & 0x07));
    word[1] = (uint8_t)((word[1] & 0xC0) | ((scalar >> 12u) & 0x3F));
    word[2] = (uint8_t)((word[2] & 0xC0) | ((scalar >> 6u) & 0x3F));
    word[3] = (uint8_t)((word[3] & 0xC0) | (scalar & 0x3F));
    return 4;
  }
  return 1;
}